

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O2

void __thiscall
Fossilize::ExternalReplayer::Impl::start_replayer_process(Impl *this,Options *options,int ctl_fd)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint i_3;
  long lVar4;
  uint i;
  ulong uVar5;
  vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_> implicit_indices;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  sched_param p;
  char whitelist_hex [9];
  char timeout [16];
  char raytracing_range_end [16];
  char raytracing_range_start [16];
  char compute_range_end [16];
  char compute_range_start [16];
  char graphics_range_end [16];
  char graphics_range_start [16];
  char index_name [16];
  char num_thread_holder [16];
  char control_fd_name [16];
  char fd_name [16];
  string self_path;
  
  sprintf(fd_name,"%d",(ulong)(uint)this->fd);
  self_path._M_dataplus._M_p = (pointer)&self_path.field_2;
  self_path._M_string_length = 0;
  self_path.field_2._M_local_buf[0] = '\0';
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = options->num_external_replayer_arguments;
  if (uVar1 == 0) {
    if (options->external_replayer_path == (char *)0x0) {
      std::__cxx11::string::assign((char *)&self_path);
      implicit_indices.
      super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)self_path._M_dataplus._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices
                );
    }
    else {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&argv,&options->external_replayer_path);
    }
  }
  else {
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&argv,(value_type *)((long)options->external_replayer_arguments + lVar4));
      uVar1 = options->num_external_replayer_arguments;
      lVar4 = lVar4 + 8;
    }
  }
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < options->num_databases; uVar5 = uVar5 + 1) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&argv,(value_type *)((long)options->databases + lVar4));
    lVar4 = lVar4 + 8;
  }
  implicit_indices.
  super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d443;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  if (options->quiet != false) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d437;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  implicit_indices.
  super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d475;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  implicit_indices.
  super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)fd_name;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  if (-1 < ctl_fd) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d481;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    sprintf(control_fd_name,"%d",(ulong)(uint)ctl_fd);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)control_fd_name;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  if (options->spirv_validate == true) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d32f;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  if (options->num_threads != 0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d3ad;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    sprintf(num_thread_holder,"%u",(ulong)options->num_threads);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)num_thread_holder;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  if (options->on_disk_pipeline_cache != (char *)0x0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d33b;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&argv,&options->on_disk_pipeline_cache);
  }
  if (options->on_disk_validation_cache != (char *)0x0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d347;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&argv,&options->on_disk_validation_cache);
  }
  if (options->on_disk_validation_whitelist != (char *)0x0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d37b;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&argv,&options->on_disk_validation_whitelist);
  }
  if (options->on_disk_validation_blacklist != (char *)0x0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d361;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&argv,&options->on_disk_validation_blacklist);
  }
  if (options->on_disk_replay_whitelist != (char *)0x0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d387;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&argv,&options->on_disk_replay_whitelist);
    sprintf(whitelist_hex,"%x",(ulong)options->on_disk_replay_whitelist_mask);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d393;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)whitelist_hex;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  if (options->on_disk_module_identifier != (char *)0x0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d42b;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&argv,&options->on_disk_module_identifier);
  }
  if (options->replayer_cache_path != (char *)0x0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d4f1;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&argv,&options->replayer_cache_path);
  }
  if (options->enable_validation == true) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d315;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  if (options->disable_signal_handler == true) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d4fd;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  if (options->disable_rate_limiter == true) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d509;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  if (options->null_device == true) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d4b1;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  implicit_indices.
  super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d2fb;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  sprintf(index_name,"%u",(ulong)options->device_index);
  implicit_indices.
  super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)index_name;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  if (options->use_pipeline_range == true) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d3d1;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    sprintf(graphics_range_start,"%u",(ulong)options->start_graphics_index);
    sprintf(graphics_range_end,"%u",(ulong)options->end_graphics_index);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)graphics_range_start;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)graphics_range_end;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d3eb;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    sprintf(compute_range_start,"%u",(ulong)options->start_compute_index);
    sprintf(compute_range_end,"%u",(ulong)options->end_compute_index);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)compute_range_start;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)compute_range_end;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d3f7;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    sprintf(raytracing_range_start,"%u",(ulong)options->start_raytracing_index);
    sprintf(raytracing_range_end,"%u",(ulong)options->end_raytracing_index);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)raytracing_range_start;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)raytracing_range_end;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  if (options->pipeline_stats_path != (char *)0x0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d411;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&argv,&options->pipeline_stats_path);
  }
  if (options->timeout_seconds != 0) {
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5d4bd;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
    sprintf(timeout,"%u",(ulong)options->timeout_seconds);
    implicit_indices.
    super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)timeout;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&implicit_indices);
  }
  implicit_indices.
  super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  implicit_indices.
  super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  implicit_indices.
  super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>::resize
            (&implicit_indices,(ulong)options->num_implicit_whitelist_indices);
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < options->num_implicit_whitelist_indices; uVar5 = uVar5 + 1) {
    _p = "--implicit-whitelist";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&p);
    sprintf((implicit_indices.
             super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar4,"%u",
            (ulong)options->implicit_whitelist_indices[uVar5]);
    _p = (implicit_indices.
          super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar4;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&p);
    lVar4 = lVar4 + 0x10;
  }
  _p = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&p);
  if (options->quiet != false) {
    iVar2 = open("/dev/null",1);
    if (-1 < iVar2) {
      dup2(iVar2,1);
      dup2(iVar2,2);
      close(iVar2);
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (options->disable_rate_limiter == false) {
    iVar2 = nice(0x13);
    if ((iVar2 == -1) && (*piVar3 != 0)) {
      fwrite("Fossilize ERROR: Failed to set nice value for external replayer!\n",0x41,1,_stderr);
    }
  }
  _p = (char *)((ulong)_p & 0xffffffff00000000);
  iVar2 = sched_setscheduler(0,3,(sched_param *)&p);
  if (iVar2 < 0) {
    fwrite("Fossilize ERROR: Failed to set scheduling policy for external replayer!\n",0x48,1,
           _stderr);
  }
  if (options->disable_rate_limiter == false) {
    lVar4 = syscall(0xfb,1,0,0x6000);
    if ((int)lVar4 < 0) {
      fwrite("Fossilize ERROR: Failed to set IO priority for external replayer!\n",0x42,1,_stderr);
    }
  }
  lVar4 = 8;
  for (uVar5 = 0; uVar5 < options->num_environment_variables; uVar5 = uVar5 + 1) {
    setenv(*(char **)((long)options->environment_variables + lVar4 + -8),
           *(char **)((long)&options->environment_variables->key + lVar4),1);
    lVar4 = lVar4 + 0x10;
  }
  iVar2 = execv(*argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  fprintf(_stderr,"Fossilize ERROR: Failed to start external process %s with execv.\n",
          options->external_replayer_path);
  if (iVar2 < 0) {
    exit(*piVar3);
  }
  exit(1);
}

Assistant:

void ExternalReplayer::Impl::start_replayer_process(const ExternalReplayer::Options &options, int ctl_fd)
{
	char fd_name[16], control_fd_name[16];
	sprintf(fd_name, "%d", fd);
	char num_thread_holder[16];

	std::string self_path;
	std::vector<const char *> argv;
	if (options.num_external_replayer_arguments)
	{
		for (unsigned i = 0; i < options.num_external_replayer_arguments; i++)
			argv.push_back(options.external_replayer_arguments[i]);
	}
	else if (options.external_replayer_path)
		argv.push_back(options.external_replayer_path);
	else
	{
#ifdef __linux__
		self_path = "/proc/self/exe";
#else
		self_path = Path::get_executable_path();
#endif
		argv.push_back(self_path.c_str());
	}

	for (unsigned i = 0; i < options.num_databases; i++)
		argv.push_back(options.databases[i]);

	argv.push_back("--master-process");
	if (options.quiet)
		argv.push_back("--quiet-slave");
	argv.push_back("--shmem-fd");
	argv.push_back(fd_name);

	if (ctl_fd >= 0)
	{
		argv.push_back("--control-fd");
		sprintf(control_fd_name, "%d", ctl_fd);
		argv.push_back(control_fd_name);
	}

	if (options.spirv_validate)
		argv.push_back("--spirv-val");

	if (options.num_threads)
	{
		argv.push_back("--num-threads");
		sprintf(num_thread_holder, "%u", options.num_threads);
		argv.push_back(num_thread_holder);
	}

	if (options.on_disk_pipeline_cache)
	{
		argv.push_back("--on-disk-pipeline-cache");
		argv.push_back(options.on_disk_pipeline_cache);
	}

	if (options.on_disk_validation_cache)
	{
		argv.push_back("--on-disk-validation-cache");
		argv.push_back(options.on_disk_validation_cache);
	}

	if (options.on_disk_validation_whitelist)
	{
		argv.push_back("--on-disk-validation-whitelist");
		argv.push_back(options.on_disk_validation_whitelist);
	}

	if (options.on_disk_validation_blacklist)
	{
		argv.push_back("--on-disk-validation-blacklist");
		argv.push_back(options.on_disk_validation_blacklist);
	}

	char whitelist_hex[9];
	if (options.on_disk_replay_whitelist)
	{
		argv.push_back("--on-disk-replay-whitelist");
		argv.push_back(options.on_disk_replay_whitelist);

		sprintf(whitelist_hex, "%x", options.on_disk_replay_whitelist_mask);
		argv.push_back("--on-disk-replay-whitelist-mask");
		argv.push_back(whitelist_hex);
	}

	if (options.on_disk_module_identifier)
	{
		argv.push_back("--on-disk-module-identifier");
		argv.push_back(options.on_disk_module_identifier);
	}

	if (options.replayer_cache_path)
	{
		argv.push_back("--replayer-cache");
		argv.push_back(options.replayer_cache_path);
	}

	if (options.enable_validation)
		argv.push_back("--enable-validation");

	if (options.disable_signal_handler)
		argv.push_back("--disable-signal-handler");
	if (options.disable_rate_limiter)
		argv.push_back("--disable-rate-limiter");

	if (options.null_device)
		argv.push_back("--null-device");

	argv.push_back("--device-index");
	char index_name[16];
	sprintf(index_name, "%u", options.device_index);
	argv.push_back(index_name);

	char graphics_range_start[16], graphics_range_end[16];
	char compute_range_start[16], compute_range_end[16];
	char raytracing_range_start[16], raytracing_range_end[16];

	if (options.use_pipeline_range)
	{
		argv.push_back("--graphics-pipeline-range");
		sprintf(graphics_range_start, "%u", options.start_graphics_index);
		sprintf(graphics_range_end, "%u", options.end_graphics_index);
		argv.push_back(graphics_range_start);
		argv.push_back(graphics_range_end);

		argv.push_back("--compute-pipeline-range");
		sprintf(compute_range_start, "%u", options.start_compute_index);
		sprintf(compute_range_end, "%u", options.end_compute_index);
		argv.push_back(compute_range_start);
		argv.push_back(compute_range_end);

		argv.push_back("--raytracing-pipeline-range");
		sprintf(raytracing_range_start, "%u", options.start_raytracing_index);
		sprintf(raytracing_range_end, "%u", options.end_raytracing_index);
		argv.push_back(raytracing_range_start);
		argv.push_back(raytracing_range_end);
	}

	if (options.pipeline_stats_path)
	{
		argv.push_back("--enable-pipeline-stats");
		argv.push_back(options.pipeline_stats_path);
	}

	char timeout[16];
	if (options.timeout_seconds)
	{
		argv.push_back("--timeout-seconds");
		sprintf(timeout, "%u", options.timeout_seconds);
		argv.push_back(timeout);
	}

	std::vector<std::array<char, 16>> implicit_indices;
	implicit_indices.resize(options.num_implicit_whitelist_indices);
	for (unsigned i = 0; i < options.num_implicit_whitelist_indices; i++)
	{
		argv.push_back("--implicit-whitelist");
		sprintf(implicit_indices[i].data(), "%u", options.implicit_whitelist_indices[i]);
		argv.push_back(implicit_indices[i].data());
	}

	argv.push_back(nullptr);

	if (options.quiet)
	{
		int null_fd = open("/dev/null", O_WRONLY);
		if (null_fd >= 0)
		{
			dup2(null_fd, STDOUT_FILENO);
			dup2(null_fd, STDERR_FILENO);
			close(null_fd);
		}
	}

	// Replayer should have idle priority.
	// nice() can return -1 in valid scenarios, need to check errno.
	errno = 0;

	if (!options.disable_rate_limiter)
	{
		if (nice(19) == -1 && errno != 0)
			LOGE("Failed to set nice value for external replayer!\n");
	}

#ifdef __linux__
	// Replayer crunches a lot of numbers, hint the scheduler.
	// This results in better throughput at the same or lower CPU usage (due
	// to better CPU cache utilization with bigger time slices), it doesn't
	// preempt interactive tasks (less impact on games), and it also makes a
	// better chance for the block layer to coalesce IO requests (more IO
	// may be dispatched per time slice).
	{
		struct sched_param p = {};
		if (sched_setscheduler(0, SCHED_BATCH, &p) < 0)
			LOGE("Failed to set scheduling policy for external replayer!\n");
	}

	if (!options.disable_rate_limiter)
	{
		// Hint the IO scheduler that we don't want a fair share of the disk
		// bandwidth.
		// https://www.kernel.org/doc/html/latest/block/ioprio.html
		if (ioprio_set(IOPRIO_WHO_PROCESS, 0, IOPRIO_PRIO_VALUE(IOPRIO_CLASS_IDLE, 0)) < 0)
			LOGE("Failed to set IO priority for external replayer!\n");
	}
#endif

#ifdef __APPLE__
	if (!options.disable_rate_limiter)
	{
		// Hint the IO scheduler that we don't want to impact foreground
		// latency.
		// https://www.unix.com/man-page/osx/3/setiopolicy_np/
		if (setiopolicy_np(IOPOL_TYPE_DISK, IOPOL_SCOPE_PROCESS, IOPOL_UTILITY) < 0)
			LOGE("Failed to set IO policy for external replayer!\n");
	}
#endif

	// We're now in the child process, so it's safe to override environment here.
	for (unsigned i = 0; i < options.num_environment_variables; i++)
		setenv(options.environment_variables[i].key, options.environment_variables[i].value, 1);

	if (execv(argv[0], const_cast<char * const*>(argv.data())) < 0)
	{
		LOGE("Failed to start external process %s with execv.\n", options.external_replayer_path);
		exit(errno);
	}
	else
	{
		LOGE("Failed to start external process %s with execv.\n", options.external_replayer_path);
		exit(1);
	}
}